

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::MethodGroup::init(MethodGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  ulong uVar1;
  IndexGroup *this_00;
  BaseVertexGroup *this_01;
  BuiltInVariableGroup *this_02;
  ulong extraout_RAX;
  AttributeGroup *this_03;
  char *name_00;
  char *descr;
  Primitive primitive_00;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  bool bVar2;
  undefined1 local_88 [8];
  string desc;
  string name;
  int ndx;
  Primitive primitive [7];
  bool indexed;
  MethodGroup *this_local;
  
  bVar2 = true;
  if ((this->m_method != DRAWMETHOD_DRAWELEMENTS_BASEVERTEX) &&
     (bVar2 = true, this->m_method != DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX)) {
    bVar2 = this->m_method == DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX;
  }
  primitive[0] = PRIMITIVE_TRIANGLE_FAN;
  primitive[1] = PRIMITIVE_TRIANGLE_STRIP;
  primitive[2] = PRIMITIVE_LINES;
  primitive[3] = PRIMITIVE_LINE_STRIP;
  uVar1 = 6;
  primitive[4] = PRIMITIVE_LINE_LOOP;
  if (bVar2) {
    this_00 = (IndexGroup *)operator_new(0x80);
    IndexGroup::IndexGroup
              (this_00,(this->super_TestCaseGroup).m_context,"indices","Index tests",this->m_method)
    ;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    this_01 = (BaseVertexGroup *)operator_new(0x80);
    BaseVertexGroup::BaseVertexGroup
              (this_01,(this->super_TestCaseGroup).m_context,"base_vertex","Base vertex tests",
               this->m_method);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
    this_02 = (BuiltInVariableGroup *)operator_new(0x80);
    BuiltInVariableGroup::BuiltInVariableGroup
              (this_02,(this->super_TestCaseGroup).m_context,"builtin_variable",
               "Built in shader variable tests",this->m_method);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
    uVar1 = extraout_RAX;
    in_RDX = extraout_RDX;
  }
  name.field_2._8_4_ = 0;
  while ((int)name.field_2._8_4_ < 7) {
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (DrawTestSpec *)(ulong)primitive[(long)(int)name.field_2._8_4_ + -2],
               (Primitive)in_RDX);
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              ((string *)local_88,
               (DrawTestSpec *)(ulong)primitive[(long)(int)name.field_2._8_4_ + -2],primitive_00);
    this_03 = (AttributeGroup *)operator_new(0x88);
    context = (this->super_TestCaseGroup).m_context;
    name_00 = (char *)std::__cxx11::string::c_str();
    descr = (char *)std::__cxx11::string::c_str();
    AttributeGroup::AttributeGroup
              (this_03,context,name_00,descr,this->m_method,
               primitive[(long)(int)name.field_2._8_4_ + -2],INDEXTYPE_SHORT,STORAGE_BUFFER);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    name.field_2._8_4_ = name.field_2._8_4_ + 1;
    uVar1 = (ulong)(uint)name.field_2._8_4_;
    in_RDX = extraout_RDX_00;
  }
  return (int)uVar1;
}

Assistant:

void MethodGroup::init (void)
{
	const bool indexed		=	(m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_BASEVERTEX)
							||	(m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX)
							||	(m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX);

	const gls::DrawTestSpec::Primitive primitive[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};

	if (indexed)
	{
		// Index-tests
		this->addChild(new IndexGroup(m_context, "indices", "Index tests", m_method));
		this->addChild(new BaseVertexGroup(m_context, "base_vertex", "Base vertex tests", m_method));
		this->addChild(new BuiltInVariableGroup(m_context, "builtin_variable", "Built in shader variable tests", m_method));
	}

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(primitive); ++ndx)
	{
		const std::string name = gls::DrawTestSpec::primitiveToString(primitive[ndx]);
		const std::string desc = gls::DrawTestSpec::primitiveToString(primitive[ndx]);

		this->addChild(new AttributeGroup(m_context, name.c_str(), desc.c_str(), m_method, primitive[ndx], gls::DrawTestSpec::INDEXTYPE_SHORT, gls::DrawTestSpec::STORAGE_BUFFER));
	}
}